

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,peek peek)

{
  time_point now;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::mutex::lock((mutex *)this);
  do_find(__return_storage_ptr__,this,key,now,peek);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

auto find(const key_type& key, peek peek = peek::no) -> std::optional<value_type>
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};
        return do_find(key, now, peek);
    }